

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackstring.hpp
# Opt level: O0

bool __thiscall
nowide::basic_stackstring<wchar_t,_char,_5UL>::convert
          (basic_stackstring<wchar_t,_char,_5UL> *this,input_char *begin,input_char *end)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  ulong buffer_size;
  wchar_t *pwVar3;
  ulong uVar4;
  output_char *poVar5;
  size_t space;
  input_char *end_local;
  input_char *begin_local;
  basic_stackstring<wchar_t,_char,_5UL> *this_local;
  
  clear(this);
  sVar2 = get_space(1,4,(long)end - (long)begin);
  buffer_size = sVar2 + 1;
  if (buffer_size < 6) {
    pwVar3 = basic_convert<wchar_t,char>(this->buffer_,5,begin,end);
    if (pwVar3 == (wchar_t *)0x0) {
      clear(this);
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = buffer_size;
    uVar4 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    poVar5 = (output_char *)operator_new__(uVar4);
    this->mem_buffer_ = poVar5;
    pwVar3 = basic_convert<wchar_t,char>(this->mem_buffer_,buffer_size,begin,end);
    if (pwVar3 == (wchar_t *)0x0) {
      clear(this);
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool convert(input_char const *begin,input_char const *end)
    {
        clear();

        size_t space = get_space(sizeof(input_char),sizeof(output_char),end - begin) + 1;
        if(space <= buffer_size) {
            if(basic_convert(buffer_,buffer_size,begin,end))
                return true;
            clear();
            return false;
        }
        else {
            mem_buffer_ = new output_char[space];
            if(!basic_convert(mem_buffer_,space,begin,end)) {
                clear();
                return false;
            }
            return true;
        }

    }